

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O0

HSL * dlib::assign_pixel_helpers::RGB2HSL(COLOUR c1)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  HSL *in_RDI;
  double dVar4;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  HSL *c2;
  double delta;
  double themax;
  double themin;
  double local_40;
  
  pdVar3 = std::min<double>(&stack0x00000010,&stack0x00000018);
  pdVar3 = std::min<double>(&stack0x00000008,pdVar3);
  dVar1 = *pdVar3;
  pdVar3 = std::max<double>(&stack0x00000010,&stack0x00000018);
  pdVar3 = std::max<double>(&stack0x00000008,pdVar3);
  dVar2 = *pdVar3;
  dVar4 = dVar2 - dVar1;
  in_RDI->l = (dVar1 + dVar2) / 2.0;
  in_RDI->s = 0.0;
  if ((0.0 < in_RDI->l) && (in_RDI->l <= 1.0 && in_RDI->l != 1.0)) {
    if (0.5 < in_RDI->l || in_RDI->l == 0.5) {
      local_40 = 2.0 - (in_RDI->l + in_RDI->l);
    }
    else {
      local_40 = in_RDI->l * 2.0;
    }
    in_RDI->s = dVar4 / local_40;
  }
  in_RDI->h = 0.0;
  if (0.0 < dVar4) {
    if (((dVar2 == in_stack_00000008) && (!NAN(dVar2) && !NAN(in_stack_00000008))) &&
       ((dVar2 != in_stack_00000010 || (NAN(dVar2) || NAN(in_stack_00000010))))) {
      in_RDI->h = (in_stack_00000010 - in_stack_00000018) / dVar4 + in_RDI->h;
    }
    if (((dVar2 == in_stack_00000010) && (!NAN(dVar2) && !NAN(in_stack_00000010))) &&
       ((dVar2 != in_stack_00000018 || (NAN(dVar2) || NAN(in_stack_00000018))))) {
      in_RDI->h = (in_stack_00000018 - in_stack_00000008) / dVar4 + 2.0 + in_RDI->h;
    }
    if (((dVar2 == in_stack_00000018) && (!NAN(dVar2) && !NAN(in_stack_00000018))) &&
       ((dVar2 != in_stack_00000008 || (NAN(dVar2) || NAN(in_stack_00000008))))) {
      in_RDI->h = (in_stack_00000008 - in_stack_00000010) / dVar4 + 4.0 + in_RDI->h;
    }
    in_RDI->h = in_RDI->h * 60.0;
  }
  return in_RDI;
}

Assistant:

inline HSL RGB2HSL(COLOUR c1)
        {
            double themin,themax,delta;
            HSL c2;
            using namespace std;

            themin = std::min(c1.r,std::min(c1.g,c1.b));
            themax = std::max(c1.r,std::max(c1.g,c1.b));
            delta = themax - themin;
            c2.l = (themin + themax) / 2;
            c2.s = 0;
            if (c2.l > 0 && c2.l < 1)
                c2.s = delta / (c2.l < 0.5 ? (2*c2.l) : (2-2*c2.l));
            c2.h = 0;
            if (delta > 0) {
                if (themax == c1.r && themax != c1.g)
                    c2.h += (c1.g - c1.b) / delta;
                if (themax == c1.g && themax != c1.b)
                    c2.h += (2 + (c1.b - c1.r) / delta);
                if (themax == c1.b && themax != c1.r)
                    c2.h += (4 + (c1.r - c1.g) / delta);
                c2.h *= 60;
            }
            return(c2);
        }